

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

double modelhess(double *A,int N,double *dx,double eps,double *L)

{
  int iVar1;
  double *array;
  int iVar2;
  double dVar3;
  double dVar4;
  int local_a8;
  int local_a4;
  int k;
  int j;
  int i;
  int step;
  double sdd;
  double offrow;
  double minev;
  double maxev;
  double maxadd;
  double maxinp;
  double maxoffdiag;
  double u;
  double maxposdiag;
  double mindiag;
  double maxdiag;
  double sqrteps;
  double *U22;
  double *L_local;
  double eps_local;
  double *dx_local;
  int N_local;
  double *A_local;
  
  dVar3 = sqrt(eps);
  array = (double *)malloc((long)N * 8 * (long)N);
  for (k = 0; k < N; k = k + 1) {
    for (local_a4 = 0; local_a4 < N; local_a4 = local_a4 + 1) {
      iVar2 = k * N + local_a4;
      A[iVar2] = A[iVar2] / (dx[k] * dx[local_a4]);
    }
  }
  for (k = 0; k < N; k = k + 1) {
    array[k] = A[k + k * N];
  }
  mindiag = array_max(array,N);
  dVar4 = array_min(array,N);
  u = 0.0;
  if (0.0 < mindiag) {
    u = mindiag;
  }
  for (k = 0; k < N; k = k + 1) {
    array[k] = 0.0;
  }
  maxoffdiag = 0.0;
  if (dVar4 <= dVar3 * u) {
    maxoffdiag = (u - dVar4) * 2.0 * dVar3 + -dVar4;
    mindiag = maxoffdiag + mindiag;
  }
  local_a8 = 0;
  for (k = 0; k < N; k = k + 1) {
    for (local_a4 = 0; local_a4 < N; local_a4 = local_a4 + 1) {
      if (k < local_a4) {
        array[local_a8] = A[k * N + local_a4];
        local_a8 = local_a8 + 1;
      }
    }
  }
  dVar4 = array_max_abs(array,local_a8);
  if (mindiag < dVar4 * (dVar3 + dVar3 + 1.0)) {
    maxoffdiag = dVar3 * 2.0 * dVar4 + (dVar4 - mindiag) + maxoffdiag;
    mindiag = dVar4 * (dVar3 + dVar3 + 1.0);
  }
  if ((mindiag == 0.0) && (!NAN(mindiag))) {
    maxoffdiag = 1.0;
    mindiag = 1.0;
  }
  if (0.0 < maxoffdiag) {
    for (k = 0; k < N; k = k + 1) {
      iVar2 = k * N + k;
      A[iVar2] = maxoffdiag + A[iVar2];
    }
  }
  if (mindiag <= dVar4 / (double)N) {
    maxadd = sqrt(dVar4 / (double)N);
  }
  else {
    maxadd = sqrt(mindiag);
  }
  maxoffdiag = cholmod(A,N,L,eps,maxadd);
  if (0.0 < maxoffdiag) {
    offrow = *A;
    minev = offrow;
    for (k = 0; k < N; k = k + 1) {
      sdd = 0.0;
      iVar2 = k * N;
      for (local_a4 = 0; iVar1 = k, local_a4 < k; local_a4 = local_a4 + 1) {
        sdd = ABS(A[iVar2 + local_a4]) + sdd;
      }
      while (local_a4 = iVar1 + 1, local_a4 < N) {
        sdd = ABS(A[iVar2 + local_a4]) + sdd;
        iVar1 = local_a4;
      }
      if (minev < A[iVar2 + k] + sdd) {
        minev = A[iVar2 + k] + sdd;
      }
      if (A[iVar2 + k] - sdd < offrow) {
        offrow = A[iVar2 + k] - sdd;
      }
    }
    _i = (minev - offrow) * dVar3 + -offrow;
    if (_i < 0.0) {
      _i = 0.0;
    }
    if (_i < maxoffdiag) {
      maxoffdiag = _i;
    }
    for (k = 0; k < N; k = k + 1) {
      iVar2 = k * N + k;
      A[iVar2] = maxoffdiag + A[iVar2];
    }
  }
  dVar3 = cholmod(A,N,L,eps,0.0);
  for (k = 0; k < N; k = k + 1) {
    for (local_a4 = 0; local_a4 < N; local_a4 = local_a4 + 1) {
      iVar2 = k * N + local_a4;
      A[iVar2] = dx[k] * dx[local_a4] * A[iVar2];
    }
  }
  for (k = 0; k < N; k = k + 1) {
    for (local_a4 = 0; local_a4 < k + 1; local_a4 = local_a4 + 1) {
      iVar2 = k * N + local_a4;
      L[iVar2] = dx[k] * L[iVar2];
    }
  }
  free(array);
  return dVar3;
}

Assistant:

double modelhess(double *A,int N,double *dx,double eps,double *L) {
	/*
	 * Algorithm 5.5.1 Dennis, Schnabel, Numerical Methods for Unconstrained Optimization and 
	 * Non-Linear Equations
	 */ 
	 double *U22;
	 double sqrteps,maxdiag,mindiag,maxposdiag,u;
	 double maxoffdiag,maxinp,maxadd;
	 double maxev,minev,offrow,sdd;
	 int step,i,j,k;
	 
	 sqrteps = sqrt(eps);
	 
	 U22 = (double*) malloc(sizeof(double) * N * N);
	 
	//scale
	
	for(i = 0;i < N;++i) {
		step = i*N;
		for(j = 0;j < N;++j) {
			A[step+j] /= (dx[i] * dx[j]);
		}
	}
	
	for(i = 0; i < N;++i) {
		U22[i] = A[i+i*N];
	}
	
	maxdiag = array_max(U22,N);
	mindiag = array_min(U22,N);
	
	maxposdiag = 0.0;
	
	if (maxdiag > maxposdiag) {
		maxposdiag = maxdiag;
	}
	
	for(i = 0; i < N;++i) {
		U22[i] = 0.0;
	}
	u = 0.0;
	if (mindiag <= sqrteps*maxposdiag) {
		u = 2 * (maxposdiag - mindiag) * sqrteps - mindiag;
		maxdiag += u;
	}
	k = 0;
	for (i = 0; i < N;++i) {
		for(j = 0;j < N;++j) {
			if (j > i) {
				U22[k] = A[i*N+j];
				k++;
			}
		}
	}
	
	maxoffdiag = array_max_abs(U22,k);
	
	if ( maxoffdiag*(1+2*sqrteps) > maxdiag) {
		u += (maxoffdiag - maxdiag) + 2*sqrteps*maxoffdiag;
		maxdiag = maxoffdiag*(1+2*sqrteps);
	}
	
	if (maxdiag == 0) {
		u = 1;
		maxdiag = 1;
	}
	
	if (u > 0) {
		for(i=0;i < N;++i) {
			A[i*N+i] += u;
		}
	}
	
	if (maxdiag > maxoffdiag / N) {
		maxinp = sqrt(maxdiag);
	} else {
		maxinp = sqrt(maxoffdiag / N);
	}
	
	maxadd = cholmod(A,N,L,eps,maxinp);
	
	if (maxadd > 0) {
		maxev = minev = A[0];
		for(i = 0; i < N;++i) {
			offrow = 0.0;
			step = i*N;
			
			for(j = 0; j < i;++j) {
				offrow += fabs(A[step+j]);
			}
			
			for(j = i+1; j < N;++j) {
				offrow += fabs(A[step+j]);
			}
			
			if (maxev < A[step+i] + offrow) {
				maxev = A[step+i] + offrow;
			}
			if (minev > A[step+i] - offrow) {
				minev = A[step+i] - offrow;
			}
			
		}
		sdd = (maxev - minev) * sqrteps - minev;
		if (sdd < 0) {
			sdd = 0;
		}
		if (maxadd > sdd) {
			u = sdd;
		} else {
			u = maxadd;
		}
		
		for(i = 0; i < N;++i) {
			A[i*N+i] += u; 
		}
	}
	
	maxadd = cholmod(A,N,L,eps,0.0);
	
	//unscale
	
	for(i = 0;i < N;++i) {
		step = i*N;
		for(j = 0;j < N;++j) {
			A[step+j] *= (dx[i] * dx[j]);
		}
	}
	
	for(i = 0;i < N;++i) {
		step = i*N;
		for(j = 0;j < i+1;++j) {
			L[step+j] *= dx[i];
		}
	}
	
	free(U22);
	
	return maxadd;
	 
}